

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall
ghc::filesystem::path::operator+=(path *this,basic_string_view<char,_std::char_traits<char>_> x)

{
  path *ppVar1;
  path *this_local;
  basic_string_view<char,_std::char_traits<char>_> x_local;
  
  x_local._M_len = (size_t)x._M_str;
  this_local = (path *)x._M_len;
  ppVar1 = concat<std::basic_string_view<char,std::char_traits<char>>>
                     (this,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(std::basic_string_view<value_type> x)
{
    return concat(x);
}